

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O1

string * __thiscall
cmQtAutoGenerators::ListQt4RccInputs
          (string *__return_storage_ptr__,cmQtAutoGenerators *this,cmSourceFile *sf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends)

{
  pointer pcVar1;
  bool bVar2;
  string *filename;
  cmSourceFileLocation *pcVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  string qrcEntry;
  string tag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string qrcContents;
  RegularExpression fileReplaceRegex;
  RegularExpression fileMatchRegex;
  value_type local_280;
  undefined1 *local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  long *local_240 [2];
  long local_230 [2];
  long *local_220;
  long local_218;
  long local_210;
  long lStack_208;
  cmSourceFile *local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1f8;
  string local_1f0;
  RegularExpression local_1d0;
  RegularExpression local_100;
  
  local_200 = sf;
  local_1f8 = depends;
  filename = cmSourceFile::GetFullPath(sf,(string *)0x0);
  ReadAll(&local_1f0,filename);
  local_100.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_100,"(<file[^<]+)");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar6 = 0;
  while (bVar2 = cmsys::RegularExpression::find(&local_100,local_1f0._M_dataplus._M_p + lVar6),
        bVar2) {
    if (local_100.startp[1] == (char *)0x0) {
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      local_280._M_string_length = 0;
      local_280.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_280,local_100.startp[1],local_100.endp[1]);
    }
    lVar6 = lVar6 + local_280._M_string_length;
    local_1d0.program = (char *)0x0;
    cmsys::RegularExpression::compile(&local_1d0,"(^<file[^>]*>)");
    cmsys::RegularExpression::find(&local_1d0,local_280._M_dataplus._M_p);
    if (local_1d0.startp[1] == (char *)0x0) {
      local_260 = &local_250;
      local_258 = 0;
      local_250 = 0;
    }
    else {
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,local_1d0.startp[1],local_1d0.endp[1]);
    }
    std::__cxx11::string::substr((ulong)&local_220,(ulong)&local_280);
    std::__cxx11::string::operator=((string *)&local_280,(string *)&local_220);
    if (local_220 != &local_210) {
      operator_delete(local_220,local_210 + 1);
    }
    bVar2 = cmsys::SystemTools::FileIsFullPath(local_280._M_dataplus._M_p);
    if (!bVar2) {
      pcVar3 = cmSourceFile::GetLocation(local_200);
      local_240[0] = local_230;
      pcVar1 = (pcVar3->Directory)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_240,pcVar1,pcVar1 + (pcVar3->Directory)._M_string_length);
      std::__cxx11::string::append((char *)local_240);
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_240,(ulong)local_280._M_dataplus._M_p);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_210 = *plVar5;
        lStack_208 = plVar4[3];
        local_220 = &local_210;
      }
      else {
        local_210 = *plVar5;
        local_220 = (long *)*plVar4;
      }
      local_218 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_280,(string *)&local_220);
      if (local_220 != &local_210) {
        operator_delete(local_220,local_210 + 1);
      }
      if (local_240[0] != local_230) {
        operator_delete(local_240[0],local_230[0] + 1);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_280._M_dataplus._M_p);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_1f8,&local_280);
    if (local_260 != &local_250) {
      operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
    }
    if (local_1d0.program != (char *)0x0) {
      operator_delete__(local_1d0.program);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,
                      CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                               local_280.field_2._M_local_buf[0]) + 1);
    }
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerators::ListQt4RccInputs(cmSourceFile* sf,
                                            std::vector<std::string>& depends)
{
  const std::string qrcContents = ReadAll(sf->GetFullPath());

  cmsys::RegularExpression fileMatchRegex("(<file[^<]+)");

  std::string entriesList;
  const char* sep = "";

  size_t offset = 0;
  while (fileMatchRegex.find(qrcContents.c_str() + offset))
    {
    std::string qrcEntry = fileMatchRegex.match(1);

    offset += qrcEntry.size();

    cmsys::RegularExpression fileReplaceRegex("(^<file[^>]*>)");
    fileReplaceRegex.find(qrcEntry);
    std::string tag = fileReplaceRegex.match(1);

    qrcEntry = qrcEntry.substr(tag.size());

    if (!cmSystemTools::FileIsFullPath(qrcEntry.c_str()))
      {
      qrcEntry = sf->GetLocation().GetDirectory() + "/" + qrcEntry;
      }

    entriesList += sep;
    entriesList += qrcEntry;
    sep = "@list_sep@";
    depends.push_back(qrcEntry);
    }
  return entriesList;
}